

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O0

bool __thiscall S2::IsOrderLess(S2 *this,LoopOrder order1,LoopOrder order2,S2PointLoopSpan loop)

{
  bool bVar1;
  BasicVector<Vector3,_double,_3UL> *pBVar2;
  reference pVVar3;
  ostream *poVar4;
  size_type sVar5;
  int local_80;
  int n;
  S2LogMessage local_68;
  S2LogMessageVoidify local_51;
  int local_50;
  int local_4c;
  int dir2;
  int dir1;
  int i2;
  int i1;
  S2 *local_38;
  undefined1 local_30 [8];
  S2PointLoopSpan loop_local;
  int iStack_18;
  LoopOrder order2_local;
  LoopOrder order1_local;
  
  loop_local.super_S2PointSpan.ptr_ = loop.super_S2PointSpan.ptr_;
  _i2 = order1;
  local_38 = this;
  local_30 = (undefined1  [8])order2;
  unique0x100001b0 = order1;
  bVar1 = operator==((LoopOrder)this,order1);
  if (!bVar1) {
    order2_local.first = (int)this;
    dir1 = order2_local.first;
    dir2 = loop_local.super_S2PointSpan.len_._4_4_;
    order2_local.dir = (int)((ulong)this >> 0x20);
    local_4c = order2_local.dir;
    local_50 = iStack_18;
    pBVar2 = (BasicVector<Vector3,_double,_3UL> *)
             S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,order2_local.first);
    pVVar3 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,dir2);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      (pBVar2,pVVar3);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
                 ,0xfd,kFatal,(ostream *)&std::cerr);
      poVar4 = S2LogMessage::stream(&local_68);
      poVar4 = std::operator<<(poVar4,"Check failed: (loop[i1]) == (loop[i2]) ");
      S2LogMessageVoidify::operator&(&local_51,poVar4);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
    }
    sVar5 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)local_30);
    local_80 = (int)sVar5;
    do {
      local_80 = local_80 + -1;
      if (local_80 < 1) {
        return false;
      }
      dir1 = local_4c + dir1;
      dir2 = local_50 + dir2;
      pBVar2 = (BasicVector<Vector3,_double,_3UL> *)
               S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,dir1);
      pVVar3 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,dir2);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                        (pBVar2,pVVar3);
      if (bVar1) {
        return true;
      }
      pBVar2 = (BasicVector<Vector3,_double,_3UL> *)
               S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,dir1);
      pVVar3 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)local_30,dir2);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator>
                        (pBVar2,pVVar3);
    } while (!bVar1);
  }
  return false;
}

Assistant:

static inline bool IsOrderLess(LoopOrder order1, LoopOrder order2,
                               S2PointLoopSpan loop) {
  if (order1 == order2) return false;

  int i1 = order1.first, i2 = order2.first;
  int dir1 = order1.dir, dir2 = order2.dir;
  S2_DCHECK_EQ(loop[i1], loop[i2]);
  for (int n = loop.size(); --n > 0; ) {
    i1 += dir1;
    i2 += dir2;
    if (loop[i1] < loop[i2]) return true;
    if (loop[i1] > loop[i2]) return false;
  }
  return false;
}